

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::IfcRamp(IfcRamp *this)

{
  *(undefined ***)&this->field_0x178 = &PTR__Object_007e6a70;
  *(undefined8 *)&this->field_0x180 = 0;
  *(char **)&this->field_0x188 = "IfcRamp";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__00819e00);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x819cd0;
  *(undefined8 *)&this->field_0x178 = 0x819de8;
  *(undefined8 *)&this->field_0x88 = 0x819cf8;
  *(undefined8 *)&this->field_0x98 = 0x819d20;
  *(undefined8 *)&this->field_0xd0 = 0x819d48;
  *(undefined8 *)&this->field_0x100 = 0x819d70;
  *(undefined8 *)&this->field_0x138 = 0x819d98;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x819dc0;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}